

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  char cVar1;
  byte bVar2;
  Mem *pVal;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  size_t sVar10;
  double dVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  char *zDate;
  byte *pbVar16;
  DateTime *p_00;
  sqlite3_context *context_00;
  float *pfVar17;
  uint uVar18;
  ulong uVar19;
  byte *pbVar20;
  ulong uVar21;
  bool bVar22;
  int Y_1;
  int M;
  int D;
  int M_1;
  int Y;
  int m;
  int h;
  int local_c4;
  DateTime *local_c0;
  double local_b8;
  int local_ac;
  sqlite3_context *local_a8;
  uint local_a0;
  int local_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined8 uStack_90;
  DateTime local_88;
  sqlite3_value **local_50;
  double local_48;
  ulong local_40;
  undefined1 local_38 [4];
  undefined1 local_34 [4];
  
  p->s = 0.0;
  p->validJD = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->nFloor = '\0';
  *(undefined4 *)&p->field_0x2c = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  local_a0 = argc;
  if (argc == 0) {
    iVar5 = sqlite3NotPureFunc(context);
    if (iVar5 == 0) {
      return 1;
    }
    iVar5 = setDateTimeToCurrent(context,p);
    return iVar5;
  }
  pVal = *argv;
  local_c0 = p;
  local_a8 = context;
  local_50 = argv;
  if (1 < "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
          [pVal->flags & 0x3f] - 1) {
    iVar5 = 1;
    pcVar12 = (char *)sqlite3ValueText(pVal,'\x01');
    if (pcVar12 == (char *)0x0) {
      return 1;
    }
    cVar1 = *pcVar12;
    uVar21 = (ulong)(cVar1 == '-');
    iVar4 = 0;
    iVar8 = getDigits(pcVar12 + uVar21,"40f-21a-21d",&local_88,&local_b8,&local_c4);
    p_00 = local_c0;
    if (iVar8 == 3) {
      zDate = pcVar12 + uVar21 + 9;
      do {
        do {
          pbVar9 = (byte *)(zDate + 1);
          zDate = zDate + 1;
        } while ((ulong)*pbVar9 == 0x54);
      } while ((""[*pbVar9] & 1) != 0);
      iVar8 = parseHhMmSs(zDate,local_c0);
      if (iVar8 != 0) {
        p = p_00;
        if (*zDate != '\0') goto LAB_001a5953;
        p_00->validHMS = '\0';
      }
      p_00->validJD = '\0';
      p_00->validYMD = '\x01';
      iVar8 = -(int)local_88.iJD;
      if (cVar1 != '-') {
        iVar8 = (int)local_88.iJD;
      }
      p_00->Y = iVar8;
      p_00->M = local_b8._0_4_;
      p_00->D = local_c4;
      computeFloor(p_00);
      if (p_00->tz != 0) {
        computeJD(p_00);
      }
    }
    else {
LAB_001a5953:
      p_00 = p;
      iVar8 = parseHhMmSs(pcVar12,p_00);
      context_00 = local_a8;
      iVar4 = 0;
      if (iVar8 != 0) {
        lVar14 = 0;
        do {
          bVar3 = pcVar12[lVar14];
          bVar2 = "now"[lVar14];
          if (bVar3 == bVar2) {
            if ((ulong)bVar3 == 0) goto LAB_001a599f;
          }
          else if (""[bVar3] != ""[bVar2]) goto LAB_001a599f;
          lVar14 = lVar14 + 1;
        } while( true );
      }
    }
    goto LAB_001a5b19;
  }
  dVar15 = sqlite3VdbeRealValue(pVal);
  p->s = dVar15;
  p->field_0x2c = p->field_0x2c | 1;
  p_00 = p;
  if ((0.0 <= dVar15) && (dVar15 < 5373484.5)) {
    p->iJD = (long)(dVar15 * 86400000.0 + 0.5);
    p->validJD = '\x01';
  }
  goto LAB_001a5b27;
LAB_001a599f:
  if ((bVar3 != bVar2) || (iVar4 = sqlite3NotPureFunc(local_a8), iVar4 == 0)) {
    sVar10 = strlen(pcVar12);
    iVar4 = sqlite3AtoF(pcVar12,(double *)&local_88,(uint)sVar10 & 0x3fffffff,'\x01');
    context_00 = local_a8;
    if (iVar4 < 1) {
      lVar14 = 0;
      do {
        bVar3 = pcVar12[lVar14];
        bVar2 = "subsec"[lVar14];
        if (bVar3 == bVar2) {
          if ((ulong)bVar3 == 0) goto LAB_001a5ab5;
        }
        else if (""[bVar3] != ""[bVar2]) goto LAB_001a5ab5;
        lVar14 = lVar14 + 1;
      } while( true );
    }
    p_00->s = (double)local_88.iJD;
    p_00->field_0x2c = p_00->field_0x2c | 1;
    iVar4 = 0;
    if ((0.0 <= (double)local_88.iJD) && ((double)local_88.iJD < 5373484.5)) {
      p_00->iJD = (long)((double)local_88.iJD * 86400000.0 + 0.5);
      p_00->validJD = '\x01';
    }
    goto LAB_001a5b19;
  }
LAB_001a5b0e:
  iVar4 = setDateTimeToCurrent(context_00,p_00);
  goto LAB_001a5b19;
LAB_001a5ae7:
  iVar4 = 1;
  if (bVar3 == bVar2) goto LAB_001a5af2;
  goto LAB_001a5b19;
LAB_001a61f5:
  iVar5 = sqlite3NotPureFunc(local_a8);
  uVar6 = 1;
  if (iVar5 == 0) goto switchD_001a5cf3_caseD_62;
  uVar6 = 0;
  if ((p_00->field_0x2c & 0x10) == 0) {
    uVar6 = toLocaltime(p_00,local_a8);
  }
  bVar3 = p_00->field_0x2c & 0xe7 | 0x10;
LAB_001a622d:
  p_00->field_0x2c = bVar3;
  goto switchD_001a5cf3_caseD_62;
LAB_001a60b5:
  if ((((1 < uVar21) || (bVar3 != bVar2)) || (p_00->validJD == '\0')) ||
     (bVar3 = p_00->field_0x2c, (bVar3 & 1) == 0)) goto switchD_001a5cf3_caseD_62;
  goto LAB_001a669b;
LAB_001a6253:
  computeJD(p_00);
  p_00->iJD = p_00->iJD - ((long)p_00->nFloor * 0x5265c0000000000 >> 0x20);
  p_00->validYMD = '\0';
  p_00->validHMS = '\0';
  p_00->tz = 0;
  goto LAB_001a67aa;
LAB_001a6235:
  computeJD(p_00);
  p_00->validYMD = '\0';
  p_00->validHMS = '\0';
  p_00->tz = 0;
  p_00->nFloor = '\0';
  goto LAB_001a67aa;
LAB_001a6007:
  if ((1 < uVar21) || (bVar3 != bVar2)) goto switchD_001a5cf3_caseD_62;
  bVar3 = p_00->field_0x2c;
  if (((bVar3 & 1) != 0) && (p_00->validJD == '\0')) {
    dVar15 = p_00->s;
    uVar6 = 0;
    if ((dVar15 < -210866760000.0) || (253402300799.0 < dVar15)) goto switchD_001a5cf3_caseD_62;
    p_00->validHMS = '\0';
    p_00->tz = 0;
    p_00->iJD = (long)(dVar15 * 1000.0 + 210866760000000.0 + 0.5);
    p_00->validJD = '\x01';
    p_00->validYMD = '\0';
    bVar3 = bVar3 & 0xfe;
    uVar6 = 0;
    goto LAB_001a622d;
  }
  goto LAB_001a669b;
LAB_001a6785:
  bVar3 = pbVar9[lVar14];
  if (bVar3 == "subsecond"[lVar14]) {
    if ((ulong)bVar3 == 0) goto LAB_001a67a6;
  }
  else if (""[bVar3] != ""[(byte)"subsecond"[lVar14]]) goto switchD_001a5cf3_caseD_62;
  lVar14 = lVar14 + 1;
  goto LAB_001a6785;
LAB_001a67a6:
  p_00->field_0x2c = p_00->field_0x2c | 4;
  goto LAB_001a67aa;
LAB_001a6577:
  if (bVar3 != bVar2) {
    lVar14 = 0;
    do {
      bVar3 = pbVar20[lVar14];
      bVar2 = "year"[lVar14];
      if (bVar3 == bVar2) {
        if ((ulong)bVar3 == 0) goto LAB_001a65b4;
      }
      else if (""[bVar3] != ""[bVar2]) goto LAB_001a65b4;
      lVar14 = lVar14 + 1;
    } while( true );
  }
  p_00->D = 1;
  goto LAB_001a67aa;
LAB_001a65b4:
  if (bVar3 != bVar2) {
    lVar14 = 0;
    do {
      bVar3 = pbVar20[lVar14];
      bVar2 = "julianday"[lVar14 + 6];
      if (bVar3 == bVar2) {
        if ((ulong)bVar3 == 0) goto LAB_001a6778;
      }
      else if (""[bVar3] != ""[bVar2]) goto LAB_001a6778;
      lVar14 = lVar14 + 1;
    } while( true );
  }
  p_00->M = 1;
  p_00->D = 1;
  goto LAB_001a67aa;
LAB_001a6778:
  uVar6 = (uint)(bVar3 != bVar2);
  goto switchD_001a5cf3_caseD_62;
LAB_001a6288:
  bVar3 = p_00->field_0x2c;
  if ((bVar3 & 1) == 0) {
LAB_001a6293:
    lVar14 = 0;
    do {
      bVar3 = pbVar9[lVar14];
      if (bVar3 == "utc"[lVar14]) {
        if ((ulong)bVar3 == 0) goto LAB_001a62ba;
      }
      else if (""[bVar3] != ""[(byte)"utc"[lVar14]]) goto switchD_001a5cf3_caseD_62;
      lVar14 = lVar14 + 1;
    } while( true );
  }
  if (((1 < uVar21) || (local_b8 = p_00->s * 1000.0 + 210866760000000.0, local_b8 < 0.0)) ||
     (464269060800000.0 <= local_b8)) goto switchD_001a5cf3_caseD_62;
  p_00->validHMS = '\0';
  p_00->tz = 0;
  p_00->iJD = (long)(local_b8 + 0.5);
  p_00->validJD = '\x01';
  p_00->validYMD = '\0';
LAB_001a669b:
  p_00->field_0x2c = bVar3 & 0xfe;
LAB_001a67aa:
  uVar6 = 0;
switchD_001a5cf3_caseD_62:
  if (uVar6 != 0) {
    return 1;
  }
  uVar21 = uVar21 + 1;
  argv = local_50;
  if (uVar21 == local_40) goto LAB_001a68ce;
  goto LAB_001a5b4b;
LAB_001a62ba:
  iVar5 = sqlite3NotPureFunc(local_a8);
  uVar6 = 1;
  if ((iVar5 != 0) && (uVar6 = 0, (p_00->field_0x2c & 8) == 0)) {
    computeJD(p_00);
    dVar15 = (double)p_00->iJD;
    local_98 = SUB84(dVar15,0);
    uStack_94 = (undefined4)((ulong)dVar15 >> 0x20);
    lVar14 = 0;
    uVar18 = 0;
    do {
      local_88.Y = 0;
      local_88.M = 0;
      local_88.s = 0.0;
      local_88.D = 0;
      local_88.h = 0;
      local_88.m = 0;
      local_88.tz = 0;
      dVar15 = (double)((long)dVar15 - lVar14);
      local_88.validJD = '\x01';
      local_88.validYMD = '\0';
      local_88.validHMS = '\0';
      local_88.nFloor = '\0';
      local_88._44_4_ = 0;
      local_88.iJD = (sqlite3_int64)dVar15;
      uVar7 = toLocaltime(&local_88,local_a8);
      pbVar16 = (byte *)(ulong)uVar7;
      if (uVar7 == 0) {
        computeJD(&local_88);
        lVar14 = local_88.iJD - CONCAT44(uStack_94,local_98);
        pbVar16 = (byte *)((ulong)pbVar9 & 0xffffffff);
      }
      uVar6 = (uint)pbVar16;
      p_00 = local_c0;
      if (uVar7 != 0) goto switchD_001a5cf3_caseD_62;
    } while ((lVar14 != 0) && (bVar22 = uVar18 < 3, pbVar9 = pbVar16, uVar18 = uVar18 + 1, bVar22));
    local_c0->iJD = 0;
    local_c0->Y = 0;
    local_c0->M = 0;
    local_c0->s = 0.0;
    local_c0->validJD = '\0';
    local_c0->validYMD = '\0';
    local_c0->validHMS = '\0';
    local_c0->nFloor = '\0';
    *(undefined4 *)&local_c0->field_0x2c = 0;
    local_c0->D = 0;
    local_c0->h = 0;
    local_c0->m = 0;
    local_c0->tz = 0;
    local_c0->iJD = (sqlite3_int64)dVar15;
    local_c0->validJD = '\x01';
    local_c0->field_0x2c = local_c0->field_0x2c & 0xe7 | 8;
    uVar6 = 0;
  }
  goto switchD_001a5cf3_caseD_62;
LAB_001a5c40:
  iVar5 = sqlite3AtoF((char *)pbVar9,&local_b8,iVar5,'\x01');
  p_00 = local_c0;
  if (0 < iVar5) {
    pbVar20 = pbVar9;
    if (pbVar9[uVar19] != 0x2d) {
LAB_001a5d2b:
      if (pbVar9[uVar19 & 0xffffffff] != 0x3a) {
        pbVar20 = pbVar20 + ((uVar19 & 0xffffffff) - 1);
        do {
          pbVar9 = pbVar20 + 1;
          pbVar20 = pbVar20 + 1;
        } while ((""[*pbVar9] & 1) != 0);
        sVar10 = strlen((char *)pbVar20);
        p_00 = local_c0;
        uVar18 = (uint)sVar10 & 0x3fffffff;
        uVar6 = 1;
        if (0xfffffff7 < uVar18 - 0xb) {
          if ((pbVar20[uVar18 - 1] & 0xdf) == 0x53) {
            uVar18 = uVar18 - 1;
          }
          computeJD(local_c0);
          local_98 = SUB84(local_b8,0);
          uStack_94 = (undefined4)((ulong)local_b8 >> 0x20);
          uStack_90 = 0;
          local_48 = *(double *)(&DAT_001c05a0 + (ulong)(local_b8 < 0.0) * 8);
          p_00->nFloor = '\0';
          pfVar17 = &aXformType[0].rXform;
          lVar14 = 0;
          do {
            if ((((uVar18 == ((anon_struct_16_4_82cfffc4 *)(pfVar17 + -3))->nName) &&
                 (iVar5 = sqlite3_strnicmp((char *)((long)pfVar17 + -0xb),(char *)pbVar20,uVar18),
                 iVar5 == 0)) && ((double)-pfVar17[-1] < (double)CONCAT44(uStack_94,local_98))) &&
               (dVar15 = (double)pfVar17[-1],
               (double)CONCAT44(uStack_94,local_98) <= dVar15 &&
               dVar15 != (double)CONCAT44(uStack_94,local_98))) {
              if ((int)lVar14 == 5) {
                dVar15 = (double)CONCAT44(uStack_94,local_98);
                computeYMD(p_00);
                computeHMS(p_00);
                p_00->Y = p_00->Y + (int)dVar15;
                computeFloor(p_00);
                p_00->validJD = '\0';
                iVar5 = (int)(double)CONCAT44(uStack_94,local_98);
LAB_001a6887:
                local_b8 = (double)CONCAT44(uStack_94,local_98) - (double)iVar5;
              }
              else if ((int)lVar14 == 4) {
                computeYMD(p_00);
                computeHMS(p_00);
                iVar5 = (int)(double)CONCAT44(uStack_94,local_98);
                iVar4 = p_00->M;
                iVar8 = iVar4 + iVar5;
                p_00->M = iVar8;
                if (iVar8 == 0 || SCARRY4(iVar4,iVar5) != iVar8 < 0) {
                  uVar6 = (iVar8 + -0xc) / 0xc;
                }
                else {
                  uVar6 = (iVar8 - 1U) / 0xc;
                }
                p_00->Y = p_00->Y + uVar6;
                p_00->M = iVar8 + uVar6 * -0xc;
                computeFloor(p_00);
                p_00->validJD = '\0';
                goto LAB_001a6887;
              }
              computeJD(p_00);
              p_00->iJD = p_00->iJD + (long)((double)*pfVar17 * local_b8 * 1000.0 + local_48);
              uVar6 = 0;
              goto LAB_001a5f45;
            }
            lVar14 = lVar14 + 1;
            pfVar17 = pfVar17 + 4;
          } while (lVar14 != 6);
          uVar6 = 1;
LAB_001a5f45:
          p_00->validYMD = '\0';
          p_00->validHMS = '\0';
          p_00->tz = 0;
        }
        goto switchD_001a5cf3_caseD_62;
      }
      local_88.s = 0.0;
      local_88.validJD = '\0';
      local_88.validYMD = '\0';
      local_88.validHMS = '\0';
      local_88.nFloor = '\0';
      local_88._44_4_ = 0;
      local_88.D = 0;
      local_88.h = 0;
      local_88.m = 0;
      local_88.tz = 0;
      local_88.iJD = 0;
      local_88.Y = 0;
      local_88.M = 0;
      iVar5 = parseHhMmSs((char *)(pbVar9 + ((ulong)*pbVar9 - 0x3a < 0xfffffffffffffff6)),&local_88)
      ;
      p_00 = local_c0;
      uVar6 = 1;
      if (iVar5 != 0) goto switchD_001a5cf3_caseD_62;
      computeJD(&local_88);
      dVar11 = (double)((local_88.iJD + -43200000) % 86400000);
      dVar15 = (double)-(long)dVar11;
      if (bVar3 != 0x2d) {
        dVar15 = dVar11;
      }
      local_88.iJD = (sqlite3_int64)dVar15;
      computeJD(p_00);
      p_00->validYMD = '\0';
      p_00->validHMS = '\0';
      p_00->tz = 0;
      p_00->iJD = p_00->iJD + (long)dVar15;
      goto LAB_001a67aa;
    }
    uVar6 = 1;
    if ((bVar3 != 0x2d) && (bVar3 != 0x2b)) goto switchD_001a5cf3_caseD_62;
    if (lVar14 == 1) {
      iVar5 = getDigits((char *)pbVar16,"40f-20a-20d",&local_c4,&local_9c,&local_ac);
      pbVar16 = pbVar9;
    }
    else {
      iVar5 = getDigits((char *)pbVar16,"50f-20a-20d",&local_c4,&local_9c,&local_ac);
    }
    iVar8 = local_9c;
    iVar4 = local_ac;
    p_00 = local_c0;
    if ((iVar5 == 3) && (local_ac < 0x1f && local_9c < 0xc)) {
      computeYMD(local_c0);
      computeHMS(p_00);
      p_00->validJD = '\0';
      if (bVar3 == 0x2d) {
        p_00->Y = p_00->Y - local_c4;
        p_00->M = p_00->M - iVar8;
        local_ac = -iVar4;
      }
      else {
        p_00->Y = p_00->Y + local_c4;
        p_00->M = p_00->M + iVar8;
      }
      iVar5 = p_00->M;
      if (iVar5 < 1) {
        uVar6 = (iVar5 + -0xc) / 0xc;
      }
      else {
        uVar6 = (iVar5 - 1U) / 0xc;
      }
      p_00->Y = p_00->Y + uVar6;
      p_00->M = iVar5 + uVar6 * -0xc;
      computeFloor(p_00);
      computeJD(p_00);
      p_00->validYMD = '\0';
      p_00->validHMS = '\0';
      p_00->iJD = p_00->iJD + (long)local_ac * 86400000;
      if ((ulong)pbVar16[0xb] == 0) goto LAB_001a67aa;
      if ((""[pbVar16[0xb]] & 1) != 0) {
        pbVar9 = pbVar16 + 0xc;
        iVar5 = getDigits((char *)pbVar9,"20c:20e",local_34,local_38);
        uVar19 = 2;
        uVar6 = 1;
        p_00 = local_c0;
        pbVar20 = pbVar16;
        if (iVar5 != 2) goto switchD_001a5cf3_caseD_62;
        goto LAB_001a5d2b;
      }
    }
  }
LAB_001a5fa7:
  uVar6 = 1;
  goto switchD_001a5cf3_caseD_62;
LAB_001a5ab5:
  if (bVar3 != bVar2) {
    lVar14 = 0;
    do {
      bVar3 = pcVar12[lVar14];
      bVar2 = "subsecond"[lVar14];
      if (bVar3 == bVar2) {
        if ((ulong)bVar3 == 0) goto LAB_001a5ae7;
      }
      else if (""[bVar3] != ""[bVar2]) goto LAB_001a5ae7;
      lVar14 = lVar14 + 1;
    } while( true );
  }
LAB_001a5af2:
  iVar4 = sqlite3NotPureFunc(local_a8);
  if (iVar4 != 0) {
    p_00->field_0x2c = p_00->field_0x2c | 4;
    goto LAB_001a5b0e;
  }
  iVar4 = 1;
LAB_001a5b19:
  argv = local_50;
  if (iVar4 == 0) {
LAB_001a5b27:
    if (1 < (int)local_a0) {
      local_40 = (ulong)local_a0;
      uVar21 = 1;
LAB_001a5b4b:
      pbVar9 = (byte *)sqlite3ValueText(argv[uVar21],'\x01');
      sqlite3ValueBytes(argv[uVar21],'\x01');
      if (pbVar9 == (byte *)0x0) {
        return 1;
      }
      bVar3 = *pbVar9;
      bVar2 = ""[bVar3];
      uVar6 = 1;
      if (0x60 < bVar2) {
        if (bVar2 < 0x73) {
          switch(bVar2) {
          case 0x61:
            lVar14 = 0;
            do {
              bVar3 = pbVar9[lVar14];
              bVar2 = "auto"[lVar14];
              if (bVar3 == bVar2) {
                if ((ulong)bVar3 == 0) goto LAB_001a6007;
              }
              else if (""[bVar3] != ""[bVar2]) goto LAB_001a6007;
              lVar14 = lVar14 + 1;
            } while( true );
          case 99:
            lVar14 = 0;
            do {
              bVar3 = pbVar9[lVar14];
              if (bVar3 == "ceiling"[lVar14]) {
                if ((ulong)bVar3 == 0) goto LAB_001a6235;
              }
              else if (""[bVar3] != ""[(byte)"ceiling"[lVar14]]) break;
              lVar14 = lVar14 + 1;
            } while( true );
          case 0x66:
            lVar14 = 0;
            do {
              bVar3 = pbVar9[lVar14];
              if (bVar3 == "floor"[lVar14]) {
                if ((ulong)bVar3 == 0) goto LAB_001a6253;
              }
              else if (""[bVar3] != ""[(byte)"floor"[lVar14]]) break;
              lVar14 = lVar14 + 1;
            } while( true );
          case 0x6a:
            lVar14 = 0;
            do {
              bVar3 = pbVar9[lVar14];
              bVar2 = "julianday"[lVar14];
              if (bVar3 == bVar2) {
                if ((ulong)bVar3 == 0) goto LAB_001a60b5;
              }
              else if (""[bVar3] != ""[bVar2]) goto LAB_001a60b5;
              lVar14 = lVar14 + 1;
            } while( true );
          case 0x6c:
            lVar14 = 0;
            do {
              bVar3 = pbVar9[lVar14];
              if (bVar3 == "localtime"[lVar14]) {
                if ((ulong)bVar3 == 0) goto LAB_001a61f5;
              }
              else if (""[bVar3] != ""[(byte)"localtime"[lVar14]]) break;
              lVar14 = lVar14 + 1;
            } while( true );
          }
          goto switchD_001a5cf3_caseD_62;
        }
        if (bVar2 == 0x73) {
          pbVar20 = pbVar9 + 9;
          lVar14 = 9;
          pcVar12 = "start of ";
          lVar13 = 0;
          pbVar16 = pbVar9;
          do {
            if ((ulong)*pbVar16 == 0) {
              pcVar12 = "start of " + lVar13;
              goto LAB_001a64f3;
            }
            if (""[*pbVar16] != ""[(byte)*pcVar12]) goto LAB_001a64f3;
            pbVar16 = pbVar16 + 1;
            lVar13 = lVar13 + 1;
            pcVar12 = (char *)((byte *)pcVar12 + 1);
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
          lVar14 = 0;
          pcVar12 = "";
          pbVar16 = pbVar20;
LAB_001a64f3:
          if ((0 < (int)lVar14) && (""[*pbVar16] != ""[(byte)*pcVar12])) {
            lVar14 = 0;
            do {
              bVar3 = pbVar9[lVar14];
              if (bVar3 == "subsec"[lVar14]) {
                if ((ulong)bVar3 == 0) goto LAB_001a67a6;
              }
              else if (""[bVar3] != ""[(byte)"subsec"[lVar14]]) {
                lVar14 = 0;
                goto LAB_001a6785;
              }
              lVar14 = lVar14 + 1;
            } while( true );
          }
          if (((p_00->validJD != '\0') || (p_00->validYMD != '\0')) || (p_00->validHMS != '\0')) {
            computeYMD(p_00);
            p_00->validHMS = '\x01';
            p_00->h = 0;
            p_00->m = 0;
            p_00->s = 0.0;
            p_00->field_0x2c = p_00->field_0x2c & 0xfe;
            p_00->tz = 0;
            p_00->validJD = '\0';
            lVar14 = 0;
            do {
              bVar3 = pbVar20[lVar14];
              bVar2 = "month"[lVar14];
              if (bVar3 == bVar2) {
                if ((ulong)bVar3 == 0) goto LAB_001a6577;
              }
              else if (""[bVar3] != ""[bVar2]) goto LAB_001a6577;
              lVar14 = lVar14 + 1;
            } while( true );
          }
          goto switchD_001a5cf3_caseD_62;
        }
        if (bVar2 != 0x77) {
          if (bVar2 == 0x75) {
            lVar14 = 0;
            do {
              bVar3 = pbVar9[lVar14];
              if (bVar3 == "unixepoch"[lVar14]) {
                if ((ulong)bVar3 == 0) goto LAB_001a6288;
              }
              else if (""[bVar3] != ""[(byte)"unixepoch"[lVar14]]) goto LAB_001a6293;
              lVar14 = lVar14 + 1;
            } while( true );
          }
          goto switchD_001a5cf3_caseD_62;
        }
        pbVar16 = pbVar9 + 8;
        lVar14 = 8;
        pcVar12 = "weekday ";
        lVar13 = 0;
        do {
          if ((ulong)*pbVar9 == 0) {
            pcVar12 = "weekday " + lVar13;
            goto LAB_001a63af;
          }
          if (""[*pbVar9] != ""[(byte)*pcVar12]) goto LAB_001a63af;
          pbVar9 = pbVar9 + 1;
          lVar13 = lVar13 + 1;
          pcVar12 = (char *)((byte *)pcVar12 + 1);
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        lVar14 = 0;
        pcVar12 = "";
        pbVar9 = pbVar16;
LAB_001a63af:
        if ((0 < (int)lVar14) && (""[*pbVar9] != ""[(byte)*pcVar12]))
        goto switchD_001a5cf3_caseD_62;
        sVar10 = strlen((char *)pbVar16);
        iVar5 = sqlite3AtoF((char *)pbVar16,&local_b8,(uint)sVar10 & 0x3fffffff,'\x01');
        if ((0 < iVar5) && (0.0 <= local_b8)) {
          uVar6 = 1;
          if (local_b8 < 7.0) {
            if ((local_b8 == (double)(int)local_b8) &&
               (!NAN(local_b8) && !NAN((double)(int)local_b8))) {
              iVar5 = (int)local_b8;
              computeYMD(p_00);
              computeHMS(p_00);
              p_00->tz = 0;
              p_00->validJD = '\0';
              computeJD(p_00);
              uVar6 = 0;
              lVar14 = (p_00->iJD + 0x7b98a00) / 86400000;
              lVar13 = (lVar14 / 7) * -7 + -7 + lVar14;
              if (lVar14 % 7 <= (long)iVar5) {
                lVar13 = lVar14 % 7;
              }
              p_00->iJD = (iVar5 - lVar13) * 86400000 + p_00->iJD;
              p_00->validYMD = '\0';
              p_00->validHMS = '\0';
              p_00->tz = 0;
            }
          }
          goto switchD_001a5cf3_caseD_62;
        }
        goto LAB_001a5fa7;
      }
      if ((bVar2 < 0x3a) && ((0x3ff280000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        pbVar16 = pbVar9 + 1;
        uVar19 = 1;
        lVar14 = 5;
        do {
          bVar2 = pbVar9[uVar19];
          iVar5 = (int)uVar19;
          if (((bVar2 == 0) || (bVar2 == 0x3a)) || ((""[bVar2] & 1) != 0)) goto LAB_001a5c40;
          if (bVar2 == 0x2d) {
            if (iVar5 == 6) {
LAB_001a5c16:
              iVar4 = getDigits((char *)pbVar16,"50f",&local_c4);
              if (iVar4 == 1) goto LAB_001a5c40;
            }
            else if (iVar5 == 5) {
              iVar4 = getDigits((char *)pbVar16,"40f",&local_c4);
              if (iVar4 == 1) goto LAB_001a5c40;
              if (lVar14 == 0) goto LAB_001a5c16;
            }
          }
          uVar19 = uVar19 + 1;
          lVar14 = lVar14 + -1;
        } while( true );
      }
      goto switchD_001a5cf3_caseD_62;
    }
LAB_001a68ce:
    computeJD(p_00);
    iVar5 = 1;
    if (((p_00->field_0x2c & 2) == 0) && ((ulong)p_00->iJD < 0x1a6401072fe00)) {
      iVar4 = 0;
      iVar5 = 0;
      if ((local_a0 == 1) && ((iVar5 = iVar4, p_00->validYMD != '\0' && (0x1c < p_00->D)))) {
        p_00->validYMD = '\0';
      }
    }
  }
  return iVar5;
}

Assistant:

static int isDate(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    if( !sqlite3NotPureFunc(context) ) return 1;
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p, i) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  if( argc==1 && p->validYMD && p->D>28 ){
    /* Make sure a YYYY-MM-DD is normalized.
    ** Example: 2023-02-31 -> 2023-03-03 */
    assert( p->validJD );
    p->validYMD = 0;
  }
  return 0;
}